

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesDeviceSetEccStatePrologue
          (ZESParameterValidation *this,zes_device_handle_t hDevice,zes_device_ecc_desc_t *newState,
          zes_device_ecc_properties_t *pState)

{
  _ze_result_t retVal;
  zes_device_ecc_properties_t *pState_local;
  zes_device_ecc_desc_t *newState_local;
  zes_device_handle_t hDevice_local;
  ZESParameterValidation *this_local;
  
  if (hDevice == (zes_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (newState == (zes_device_ecc_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pState == (zes_device_ecc_properties_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if ((int)newState->state < 3) {
    this_local._4_4_ =
         ParameterValidation::validateExtensions<_zes_device_ecc_desc_t_const*>(newState);
    if (this_local._4_4_ == ZE_RESULT_SUCCESS) {
      this_local._4_4_ =
           ParameterValidation::validateExtensions<_zes_device_ecc_properties_t*>(pState);
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesDeviceSetEccStatePrologue(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        const zes_device_ecc_desc_t* newState,          ///< [in] Pointer to desired ECC state.
        zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == newState )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pState )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZES_DEVICE_ECC_STATE_DISABLED < newState->state )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(newState);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(pState);
        return retVal;
    }